

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_node_base *__lhs;
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  string *psVar5;
  pointer pbVar6;
  allocator local_221;
  string *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string langFlagRegexVar;
  RegularExpression r;
  
  local_220 = flags;
  std::__cxx11::string::string((string *)&local_218,"CMAKE_",(allocator *)&opts);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,&local_218,
                 lang);
  std::operator+(&langFlagRegexVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                 "_FLAG_REGEX");
  std::__cxx11::string::~string((string *)&r);
  std::__cxx11::string::~string((string *)&local_218);
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&langFlagRegexVar);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&r,"COMPILE_FLAGS",(allocator *)&local_218);
    pcVar2 = cmGeneratorTarget::GetProperty(target,(string *)&r);
    std::__cxx11::string::~string((string *)&r);
    if (pcVar2 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[7])(this,local_220,pcVar2);
    }
    r.startp[0] = (char *)0x0;
    r.startp[1] = (char *)0x0;
    r.startp[2] = (char *)0x0;
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&r,config,lang);
    for (pcVar2 = r.startp[0]; pcVar2 != r.startp[1]; pcVar2 = pcVar2 + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,local_220,pcVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&r);
  }
  else {
    cmsys::RegularExpression::RegularExpression(&r,pcVar2);
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_218,"COMPILE_FLAGS",&local_221);
    pcVar2 = cmGeneratorTarget::GetProperty(target,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    if (pcVar2 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(pcVar2,&opts);
    }
    cmGeneratorTarget::GetCompileOptions(target,&opts,config,lang);
    for (pbVar6 = opts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != opts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      bVar1 = cmsys::RegularExpression::find(&r,(pbVar6->_M_dataplus)._M_p);
      if (bVar1) {
        (*this->_vptr_cmLocalGenerator[8])(this,local_220,pbVar6);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&opts);
    cmsys::RegularExpression::~RegularExpression(&r);
  }
  p_Var3 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 ==
        &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header) {
      AddCompilerRequirementFlag(this,local_220,target,lang);
LAB_003c38cf:
      std::__cxx11::string::~string((string *)&langFlagRegexVar);
      return;
    }
    __lhs = p_Var3 + 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   "_STANDARD");
    pcVar2 = cmGeneratorTarget::GetProperty(target,(string *)&r);
    std::__cxx11::string::~string((string *)&r);
    if (pcVar2 != (char *)0x0) {
      this_00 = this->Makefile;
      std::__cxx11::string::string((string *)&r,pcVar2,(allocator *)&local_218);
      bVar1 = cmMakefile::IsLaterStandard
                        (this_00,(string *)__lhs,(string *)&r,(string *)(p_Var3 + 2));
      std::__cxx11::string::~string((string *)&r);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
        poVar4 = std::operator<<((ostream *)&r,"The COMPILE_FEATURES property of target \"");
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        poVar4 = std::operator<<(poVar4,"_STANDARD\" was \"");
        poVar4 = std::operator<<(poVar4,(string *)(p_Var3 + 2));
        poVar4 = std::operator<<(poVar4,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        poVar4 = std::operator<<(poVar4,"_STANDARD\" \"");
        poVar4 = std::operator<<(poVar4,pcVar2);
        poVar4 = std::operator<<(poVar4,
                                 "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&r);
        goto LAB_003c38cf;
      }
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    cmsys::RegularExpression r(langFlagRegexStr);
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    for (std::vector<std::string>::const_iterator i = opts.begin();
         i != opts.end(); ++i) {
      if (r.find(i->c_str())) {
        // (Re-)Escape this flag.  COMPILE_FLAGS were already parsed
        // as a command line above, and COMPILE_OPTIONS are escaped.
        this->AppendFlagEscape(flags, *i);
      }
    }
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    for (std::vector<std::string>::const_iterator i = opts.begin();
         i != opts.end(); ++i) {
      // COMPILE_OPTIONS are escaped.
      this->AppendFlagEscape(flags, *i);
    }
  }

  for (std::map<std::string, std::string>::const_iterator it =
         target->GetMaxLanguageStandards().begin();
       it != target->GetMaxLanguageStandards().end(); ++it) {
    const char* standard = target->GetProperty(it->first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it->first, standard, it->second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it->first << "_STANDARD\" was \"" << it->second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it->first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);
}